

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O0

void __thiscall pbrt::ParsedParameter::AddString(ParsedParameter *this,string_view str)

{
  bool bVar1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  const_iterator __beg;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  char (*in_stack_ffffffffffffffc0) [48];
  char *in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffd4;
  undefined8 in_stack_ffffffffffffffd8;
  LogLevel in_stack_ffffffffffffffe4;
  
  bVar1 = pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::empty
                    ((vector<float,_pstd::pmr::polymorphic_allocator<float>_> *)0x7391cc);
  if (((bVar1) &&
      (bVar1 = pstd::vector<int,_pstd::pmr::polymorphic_allocator<int>_>::empty
                         ((vector<int,_pstd::pmr::polymorphic_allocator<int>_> *)0x7391e0), bVar1))
     && (bVar1 = pstd::vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_>::
                 empty((vector<unsigned_char,_pstd::pmr::polymorphic_allocator<unsigned_char>_> *)
                       0x7391f7), bVar1)) {
    value = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            &stack0xfffffffffffffff0;
    this_00 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)std::basic_string_view<char,_std::char_traits<char>_>::begin
                           ((basic_string_view<char,_std::char_traits<char>_> *)value);
    __beg = std::basic_string_view<char,_std::char_traits<char>_>::end
                      ((basic_string_view<char,_std::char_traits<char>_> *)value);
    this_01 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              &stack0xffffffffffffffc7;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<char_const*,void>
              (this_01,__beg,(char *)this_00,(allocator<char> *)value);
    pstd::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_pstd::pmr::polymorphic_allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back(this_00,value);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffffc8);
    std::allocator<char>::~allocator((allocator<char> *)&stack0xffffffffffffffc7);
    return;
  }
  LogFatal<char_const(&)[48]>
            (in_stack_ffffffffffffffe4,(char *)in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd4,
             in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
}

Assistant:

void ParsedParameter::AddString(std::string_view str) {
    CHECK(floats.empty() && ints.empty() && bools.empty());
    strings.push_back({str.begin(), str.end()});
}